

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

void __thiscall pbrt::MeasuredBxDFData::MeasuredBxDFData(MeasuredBxDFData *this,Allocator alloc)

{
  PiecewiseLinear2D<3UL> *in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  Allocator unaff_retaddr;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff78;
  polymorphic_allocator<float> *in_stack_ffffffffffffff80;
  polymorphic_allocator<float> local_18 [2];
  
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(in_RDI,local_18);
  PiecewiseLinear2D<3UL>::PiecewiseLinear2D(in_RSI,unaff_retaddr);
  PiecewiseLinear2D<0UL>::PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)in_RSI,unaff_retaddr);
  PiecewiseLinear2D<2UL>::PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)in_RSI,unaff_retaddr);
  PiecewiseLinear2D<0UL>::PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)in_RSI,unaff_retaddr);
  PiecewiseLinear2D<2UL>::PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)in_RSI,unaff_retaddr);
  std::__cxx11::string::string((string *)&in_RDI[0x1a].nStored);
  return;
}

Assistant:

MeasuredBxDFData(Allocator alloc)
        : ndf(alloc),
          sigma(alloc),
          vndf(alloc),
          luminance(alloc),
          spectra(alloc),
          wavelengths(alloc) {}